

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

void __thiscall IntBounds::Verify(IntBounds *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->constantUpperBound < this->constantLowerBound) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x2e,"(constantLowerBound <= constantUpperBound)",
                       "constantLowerBound <= constantUpperBound");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void IntBounds::Verify() const
{
    Assert(this);
    Assert(constantLowerBound <= constantUpperBound);
    Assert(HasBounds());
}